

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O3

MontgomeryPoint *
ecc_montgomery_diff_add(MontgomeryPoint *P,MontgomeryPoint *Q,MontgomeryPoint *PminusQ)

{
  MontgomeryCurve *pMVar1;
  MontgomeryPoint *pMVar2;
  mp_int *x;
  mp_int *x_00;
  mp_int *y;
  mp_int *y_00;
  mp_int *x_01;
  mp_int *y_01;
  mp_int *x_02;
  mp_int *x_03;
  mp_int *x_04;
  mp_int *x_05;
  mp_int *pmVar3;
  
  pMVar1 = P->mc;
  if (Q->mc != pMVar1) {
    __assert_fail("Q->mc == mc",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                  ,0x29a,
                  "MontgomeryPoint *ecc_montgomery_diff_add(MontgomeryPoint *, MontgomeryPoint *, MontgomeryPoint *)"
                 );
  }
  if (PminusQ->mc == pMVar1) {
    pMVar2 = (MontgomeryPoint *)safemalloc(1,0x18,0);
    pMVar2->mc = pMVar1;
    pMVar2->X = (mp_int *)0x0;
    pMVar2->Z = (mp_int *)0x0;
    x = monty_sub(pMVar1->mc,P->X,P->Z);
    x_00 = monty_add(pMVar1->mc,P->X,P->Z);
    y = monty_sub(pMVar1->mc,Q->X,Q->Z);
    y_00 = monty_add(pMVar1->mc,Q->X,Q->Z);
    x_01 = monty_mul(pMVar1->mc,x,y_00);
    y_01 = monty_mul(pMVar1->mc,x_00,y);
    x_02 = monty_add(pMVar1->mc,x_01,y_01);
    x_03 = monty_sub(pMVar1->mc,x_01,y_01);
    x_04 = monty_mul(pMVar1->mc,x_02,x_02);
    x_05 = monty_mul(pMVar1->mc,x_03,x_03);
    pmVar3 = monty_mul(pMVar1->mc,x_04,PminusQ->Z);
    pMVar2->X = pmVar3;
    pmVar3 = monty_mul(pMVar1->mc,x_05,PminusQ->X);
    pMVar2->Z = pmVar3;
    mp_free(x);
    mp_free(x_00);
    mp_free(y);
    mp_free(y_00);
    mp_free(x_01);
    mp_free(y_01);
    mp_free(x_02);
    mp_free(x_03);
    mp_free(x_04);
    mp_free(x_05);
    return pMVar2;
  }
  __assert_fail("PminusQ->mc == mc",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                ,0x29b,
                "MontgomeryPoint *ecc_montgomery_diff_add(MontgomeryPoint *, MontgomeryPoint *, MontgomeryPoint *)"
               );
}

Assistant:

MontgomeryPoint *ecc_montgomery_diff_add(
    MontgomeryPoint *P, MontgomeryPoint *Q, MontgomeryPoint *PminusQ)
{
    MontgomeryCurve *mc = P->mc;
    assert(Q->mc == mc);
    assert(PminusQ->mc == mc);

    /*
     * Differential addition is achieved using the following formula
     * that relates the affine x-coordinates of P, Q, P+Q and P-Q:
     *
     * x(P+Q) x(P-Q) (x(Q)-x(P))^2 = (x(P)x(Q) - 1)^2
     *
     * As with the Weierstrass coordinates, the code below transforms
     * that affine relation into a projective one to avoid having to
     * do a division during the main arithmetic.
     */

    MontgomeryPoint *S = ecc_montgomery_point_new_empty(mc);

    mp_int *Px_m_Pz = monty_sub(mc->mc, P->X, P->Z);
    mp_int *Px_p_Pz = monty_add(mc->mc, P->X, P->Z);
    mp_int *Qx_m_Qz = monty_sub(mc->mc, Q->X, Q->Z);
    mp_int *Qx_p_Qz = monty_add(mc->mc, Q->X, Q->Z);
    mp_int *PmQp = monty_mul(mc->mc, Px_m_Pz, Qx_p_Qz);
    mp_int *PpQm = monty_mul(mc->mc, Px_p_Pz, Qx_m_Qz);
    mp_int *Xpre = monty_add(mc->mc, PmQp, PpQm);
    mp_int *Zpre = monty_sub(mc->mc, PmQp, PpQm);
    mp_int *Xpre2 = monty_mul(mc->mc, Xpre, Xpre);
    mp_int *Zpre2 = monty_mul(mc->mc, Zpre, Zpre);
    S->X = monty_mul(mc->mc, Xpre2, PminusQ->Z);
    S->Z = monty_mul(mc->mc, Zpre2, PminusQ->X);

    mp_free(Px_m_Pz);
    mp_free(Px_p_Pz);
    mp_free(Qx_m_Qz);
    mp_free(Qx_p_Qz);
    mp_free(PmQp);
    mp_free(PpQm);
    mp_free(Xpre);
    mp_free(Zpre);
    mp_free(Xpre2);
    mp_free(Zpre2);

    return S;
}